

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall InterCode::InterCode(InterCode *this,int k,Operand *t,Operand *a1)

{
  Operand *in_RDX;
  undefined4 in_ESI;
  undefined4 *in_RDI;
  Operand *this_00;
  
  *in_RDI = in_ESI;
  this_00 = (Operand *)(in_RDI + 2);
  Operand::Operand(this_00,in_RDX);
  Operand::Operand(this_00,in_RDX);
  Operand::Operand(this_00);
  return;
}

Assistant:

InterCode(int k, Operand t, Operand a1): kind(k), target(move(t)), arg1(move(a1)) {}